

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int al_fungetc(ALLEGRO_FILE *f,int c)

{
  long lVar1;
  int in_ESI;
  long *in_RDI;
  int local_4;
  
  if (*(long *)(*in_RDI + 0x58) == 0) {
    if ((int)in_RDI[4] == 0x10) {
      local_4 = -1;
    }
    else {
      lVar1 = in_RDI[4];
      *(int *)(in_RDI + 4) = (int)lVar1 + 1;
      *(char *)((long)in_RDI + (long)(int)lVar1 + 0x10) = (char)in_ESI;
      local_4 = in_ESI;
    }
  }
  else {
    local_4 = (**(code **)(*in_RDI + 0x58))(in_RDI,in_ESI);
  }
  return local_4;
}

Assistant:

int al_fungetc(ALLEGRO_FILE *f, int c)
{
   ASSERT(f != NULL);

   if (f->vtable->fi_fungetc) {
      return f->vtable->fi_fungetc(f, c);
   }
   else {
      /* If the interface does not provide an implementation for ungetc,
       * then a default one will be used. (Note that if the interface does
       * implement it, then this ungetc buffer will never be filled, and all
       * other references to it within this file will always be ignored.)
       */
      if (f->ungetc_len == ALLEGRO_UNGETC_SIZE) {
         return EOF;
      }

      f->ungetc[f->ungetc_len++] = (unsigned char) c;

      return c;
   }
}